

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

void __thiscall
cmCTestRunTest::SetupResourcesEnvironment
          (cmCTestRunTest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color __val;
  _Base_ptr p_Var2;
  char cVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  _Rb_tree_color _Var8;
  ulong uVar9;
  size_type *psVar10;
  ulong *puVar11;
  char cVar12;
  undefined8 uVar13;
  ulong uVar14;
  string __str;
  string resourceList;
  string __str_3;
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resourceType;
  string processCount;
  long *local_178;
  uint local_170;
  undefined4 uStack_16c;
  long local_168 [2];
  long *local_158;
  ulong local_150;
  long local_148;
  undefined8 uStack_140;
  string local_138;
  ulong local_118;
  ulong *local_110;
  uint local_108;
  undefined4 uStack_104;
  ulong local_100 [2];
  string local_f0;
  pointer local_d0;
  string local_c8;
  _Base_ptr local_a8;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  _Base_ptr local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CTEST_RESOURCE_GROUP_COUNT=","");
  uVar14 = ((long)(this->AllocatedResources).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->AllocatedResources).
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  cVar12 = '\x01';
  if (9 < uVar14) {
    uVar9 = uVar14;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001e4ee0;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001e4ee0;
      }
      if (uVar9 < 10000) goto LAB_001e4ee0;
      bVar4 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_001e4ee0:
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_178,local_170,uVar14);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_178);
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  cmsys::SystemTools::PutEnv(&local_80);
  if (log != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(log,&local_80);
  }
  local_d0 = (this->AllocatedResources).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->AllocatedResources).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d0 != local_40) {
    paVar1 = &local_f0.field_2;
    local_118 = 0;
    do {
      local_178 = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"CTEST_RESOURCE_GROUP_","");
      cVar12 = '\x01';
      if (9 < local_118) {
        uVar14 = local_118;
        cVar3 = '\x04';
        do {
          cVar12 = cVar3;
          if (uVar14 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_001e5034;
          }
          if (uVar14 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_001e5034;
          }
          if (uVar14 < 10000) goto LAB_001e5034;
          bVar4 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar3 = cVar12 + '\x04';
        } while (bVar4);
        cVar12 = cVar12 + '\x01';
      }
LAB_001e5034:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,local_118);
      std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_138._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_178,(long)local_178 + CONCAT44(uStack_16c,local_170));
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_138,
                 CONCAT44(local_138._M_string_length._4_4_,(uint)local_138._M_string_length),0,
                 '\x01');
      std::__cxx11::string::push_back((char)&local_178);
      p_Var7 = (local_d0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_38 = &(local_d0->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (p_Var7 != local_38) {
        bVar4 = true;
        do {
          if (!bVar4) {
            std::__cxx11::string::push_back((char)&local_138);
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,*(long *)(p_Var7 + 1),
                     (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_a0._M_dataplus._M_p);
          cmsys::SystemTools::UpperCase(&local_f0,&local_a0);
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_178);
          plVar6 = puVar5 + 2;
          if ((long *)*puVar5 == plVar6) {
            local_148 = *plVar6;
            uStack_140 = puVar5[3];
            local_158 = &local_148;
          }
          else {
            local_148 = *plVar6;
            local_158 = (long *)*puVar5;
          }
          local_150 = puVar5[1];
          *puVar5 = plVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          local_a8 = p_Var7;
          plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_158,local_150,0,'\x01');
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar10 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_c8.field_2._M_allocated_capacity = *psVar10;
            local_c8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar10;
            local_c8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_c8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = *(_Base_ptr *)(local_a8 + 2);
          p_Var2 = local_a8[2]._M_parent;
          if (p_Var7 != p_Var2) {
            bVar4 = true;
            do {
              if (!bVar4) {
                std::__cxx11::string::push_back((char)&local_c8);
              }
              std::operator+(&local_60,"id:",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var7);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
              puVar11 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_f0.field_2._M_allocated_capacity = *puVar11;
                local_f0.field_2._8_8_ = plVar6[3];
                local_f0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_f0.field_2._M_allocated_capacity = *puVar11;
                local_f0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_f0._M_string_length = plVar6[1];
              *plVar6 = (long)puVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              __val = p_Var7[1]._M_color;
              cVar12 = '\x01';
              if (9 < __val) {
                _Var8 = __val;
                cVar3 = '\x04';
                do {
                  cVar12 = cVar3;
                  if (_Var8 < 100) {
                    cVar12 = cVar12 + -2;
                    goto LAB_001e5352;
                  }
                  if (_Var8 < 1000) {
                    cVar12 = cVar12 + -1;
                    goto LAB_001e5352;
                  }
                  if (_Var8 < 10000) goto LAB_001e5352;
                  bVar4 = 99999 < _Var8;
                  _Var8 = _Var8 / 10000;
                  cVar3 = cVar12 + '\x04';
                } while (bVar4);
                cVar12 = cVar12 + '\x01';
              }
LAB_001e5352:
              local_110 = local_100;
              std::__cxx11::string::_M_construct((ulong)&local_110,cVar12);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110,local_108,__val);
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != paVar1) {
                uVar13 = local_f0.field_2._M_allocated_capacity;
              }
              uVar14 = CONCAT44(uStack_104,local_108) + local_f0._M_string_length;
              if ((ulong)uVar13 < uVar14) {
                uVar9 = 0xf;
                if (local_110 != local_100) {
                  uVar9 = local_100[0];
                }
                if (uVar9 < uVar14) goto LAB_001e53da;
                puVar5 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_110,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p
                                   );
              }
              else {
LAB_001e53da:
                puVar5 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
              }
              plVar6 = puVar5 + 2;
              if ((long *)*puVar5 == plVar6) {
                local_148 = *plVar6;
                uStack_140 = puVar5[3];
                local_158 = &local_148;
              }
              else {
                local_148 = *plVar6;
                local_158 = (long *)*puVar5;
              }
              local_150 = puVar5[1];
              *puVar5 = plVar6;
              puVar5[1] = 0;
              *(undefined1 *)plVar6 = 0;
              std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_158);
              if (local_158 != &local_148) {
                operator_delete(local_158,local_148 + 1);
              }
              if (local_110 != local_100) {
                operator_delete(local_110,local_100[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != paVar1) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              p_Var7 = (_Base_ptr)&p_Var7[1]._M_parent;
              bVar4 = false;
            } while (p_Var7 != p_Var2);
          }
          cmsys::SystemTools::PutEnv(&local_c8);
          if (log != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(log,&local_c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
          bVar4 = false;
        } while (p_Var7 != local_38);
      }
      cmsys::SystemTools::PutEnv(&local_138);
      if (log != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(log,&local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_178 != local_168) {
        operator_delete(local_178,local_168[0] + 1);
      }
      local_118 = local_118 + 1;
      local_d0 = local_d0 + 1;
    } while (local_d0 != local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestRunTest::SetupResourcesEnvironment(std::vector<std::string>* log)
{
  std::string processCount = "CTEST_RESOURCE_GROUP_COUNT=";
  processCount += std::to_string(this->AllocatedResources.size());
  cmSystemTools::PutEnv(processCount);
  if (log) {
    log->push_back(processCount);
  }

  std::size_t i = 0;
  for (auto const& process : this->AllocatedResources) {
    std::string prefix = "CTEST_RESOURCE_GROUP_";
    prefix += std::to_string(i);
    std::string resourceList = prefix + '=';
    prefix += '_';
    bool firstType = true;
    for (auto const& it : process) {
      if (!firstType) {
        resourceList += ',';
      }
      firstType = false;
      auto resourceType = it.first;
      resourceList += resourceType;
      std::string var = prefix + cmSystemTools::UpperCase(resourceType) + '=';
      bool firstName = true;
      for (auto const& it2 : it.second) {
        if (!firstName) {
          var += ';';
        }
        firstName = false;
        var += "id:" + it2.Id + ",slots:" + std::to_string(it2.Slots);
      }
      cmSystemTools::PutEnv(var);
      if (log) {
        log->push_back(var);
      }
    }
    cmSystemTools::PutEnv(resourceList);
    if (log) {
      log->push_back(resourceList);
    }
    ++i;
  }
}